

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O3

int check_str(FitsKey *pkey,FILE *out)

{
  if (pkey->ktype != STR_KEY) {
    if ((pkey->ktype == UNKNOWN) && (pkey->kvalue[0] == '\0')) {
      sprintf(errmes,"Keyword #%d, %s has a null value; expected a string.",
              (ulong)(uint)pkey->kindex);
    }
    else {
      sprintf(errmes,"Keyword #%d, %s: \"%s\" is not a string.",(ulong)(uint)pkey->kindex,pkey,
              pkey->kvalue);
    }
    wrterr(out,errmes,1);
    return 0;
  }
  return 1;
}

Assistant:

int check_str(FitsKey* pkey, FILE *out) 
{
    if(pkey->ktype == UNKNOWN && *(pkey->kvalue) == 0) {
        sprintf(errmes,"Keyword #%d, %s has a null value; expected a string.",
        pkey->kindex,pkey->kname);
        wrterr(out,errmes,1); 
        return 0;
    } else if(pkey->ktype != STR_KEY) { 
        sprintf(errmes,"Keyword #%d, %s: \"%s\" is not a string.",
        pkey->kindex,pkey->kname, pkey->kvalue);
        wrterr(out,errmes,1); 
        return 0;
    } 
    return 1;
}